

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clGetSupportedD3D11TextureFormatsINTEL
                 (cl_context context,cl_mem_flags flags,cl_mem_object_type image_type,cl_uint plane,
                 cl_uint num_entries,DXGI_FORMAT *d3d11_formats,cl_uint *num_texture_formats)

{
  _Rb_tree_header *p_Var1;
  CLIntercept *this;
  undefined8 uVar2;
  byte bVar3;
  cl_int errorCode;
  cl_platform_id p_Var4;
  mapped_type *pmVar5;
  time_point end;
  undefined4 in_register_0000000c;
  _Base_ptr p_Var6;
  undefined4 in_register_00000014;
  _Base_ptr p_Var7;
  time_point local_a0;
  undefined1 local_88 [32];
  __int_type local_68;
  undefined8 local_60;
  DXGI_FORMAT *local_58;
  string local_50;
  
  this = g_pIntercept;
  local_60 = CONCAT44(in_register_0000000c,plane);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x22;
  }
  p_Var4 = CLIntercept::getPlatform(g_pIntercept,context);
  p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_001391fa:
    local_88._0_8_ = (key_type)0x0;
    pmVar5 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_88);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(cl_platform_id *)(p_Var6 + 1) >= p_Var4) {
        p_Var7 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < p_Var4];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var1) || (p_Var4 < *(cl_platform_id *)(p_Var7 + 1)))
    goto LAB_001391fa;
    pmVar5 = (mapped_type *)&p_Var7[1]._M_parent;
  }
  if (pmVar5->clGetSupportedD3D11TextureFormatsINTEL ==
      (_func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_cl_uint_DXGI_FORMAT_ptr_cl_uint_ptr
       *)0x0) {
    return -0x22;
  }
  local_68 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  local_58 = d3d11_formats;
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_flags_abi_cxx11_((string *)local_88,&this->m_EnumNameMap,flags);
    uVar2 = local_88._0_8_;
    CEnumNameMap::name_abi_cxx11_(&local_50,&this->m_EnumNameMap,image_type);
    CLIntercept::callLoggingEnter
              (this,"clGetSupportedD3D11TextureFormatsINTEL",local_68,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX), image_type = %s (%X), plane = %u",context,uVar2,
               flags,local_50._M_dataplus._M_p,CONCAT44(in_register_00000014,image_type),local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((key_type)local_88._0_8_ != (key_type)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_a0.__d.__r = (duration)0;
  }
  else {
    local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar5->clGetSupportedD3D11TextureFormatsINTEL)
                        (context,flags,image_type,(cl_uint)local_60,num_entries,local_58,
                         num_texture_formats);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_68 &&
        (local_68 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_88._0_8_ = (key_type)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
      CLIntercept::updateHostTimingStats
                (this,"clGetSupportedD3D11TextureFormatsINTEL",(string *)local_88,local_a0,end);
      if ((key_type)local_88._0_8_ != (key_type)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((bool)bVar3 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0013941e;
    }
    else if (errorCode == 0) goto LAB_001393f3;
  }
  else {
    if (errorCode == 0) {
LAB_001393f3:
      errorCode = 0;
      goto LAB_0013941e;
    }
    CLIntercept::logError(this,"clGetSupportedD3D11TextureFormatsINTEL",errorCode);
    bVar3 = (this->m_Config).ErrorAssert;
  }
  if ((bVar3 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_0013941e:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clGetSupportedD3D11TextureFormatsINTEL",errorCode,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_88._0_8_ = (key_type)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clGetSupportedD3D11TextureFormatsINTEL",(string *)local_88,false,0,local_a0,end
              );
    if ((key_type)local_88._0_8_ != (key_type)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetSupportedD3D11TextureFormatsINTEL(
    cl_context context,
    cl_mem_flags flags,
    cl_mem_object_type image_type,
    cl_uint plane,
    cl_uint num_entries,
    DXGI_FORMAT* d3d11_formats,
    cl_uint* num_texture_formats)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clGetSupportedD3D11TextureFormatsINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), image_type = %s (%X), plane = %u",
                context,
                pIntercept->enumName().name_mem_flags( flags ).c_str(),
                flags,
                pIntercept->enumName().name( image_type ).c_str(),
                image_type,
                plane );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clGetSupportedD3D11TextureFormatsINTEL(
                context,
                flags,
                image_type,
                plane,
                num_entries,
                d3d11_formats,
                num_texture_formats);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }
    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}